

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowdiscrepancy.cpp
# Opt level: O0

vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_> *
pbrt::ComputeRadicalInversePermutations(uint32_t seed,Allocator alloc)

{
  Allocator alloc_00;
  vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_> *this;
  reference pvVar1;
  size_type in_RSI;
  vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_>
  *unaff_retaddr;
  uint32_t in_stack_00000018;
  int i;
  vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_> *perms;
  undefined4 in_stack_00000028;
  undefined8 local_30;
  polymorphic_allocator<std::byte> *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar2;
  
  this = pstd::pmr::polymorphic_allocator<std::byte>::
         new_object<pstd::vector<pbrt::DigitPermutation,pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>>,pstd::pmr::polymorphic_allocator<std::byte>&>
                   ((polymorphic_allocator<std::byte> *)
                    CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                    in_stack_ffffffffffffffd8);
  pstd::vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_>::
  resize(unaff_retaddr,in_RSI);
  for (iVar2 = 0; iVar2 < 1000; iVar2 = iVar2 + 1) {
    alloc_00.memoryResource._4_4_ = seed;
    alloc_00.memoryResource._0_4_ = in_stack_00000028;
    DigitPermutation::DigitPermutation((DigitPermutation *)perms,i,in_stack_00000018,alloc_00);
    pvVar1 = pstd::
             vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_>
             ::operator[](this,(long)iVar2);
    pvVar1->base = (undefined4)local_30;
    pvVar1->nDigits = local_30._4_4_;
    pvVar1->permutations = (uint16_t *)in_stack_ffffffffffffffd8;
  }
  return this;
}

Assistant:

pstd::vector<DigitPermutation> *ComputeRadicalInversePermutations(uint32_t seed,
                                                                  Allocator alloc) {
    pstd::vector<DigitPermutation> *perms =
        alloc.new_object<pstd::vector<DigitPermutation>>(alloc);
    perms->resize(PrimeTableSize);
    for (int i = 0; i < PrimeTableSize; ++i)
        (*perms)[i] = DigitPermutation(Primes[i], seed, alloc);
    return perms;
}